

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_allocator.cpp
# Opt level: O1

void __thiscall duckdb::FixedSizeAllocator::Free(FixedSizeAllocator *this,IndexPointer ptr)

{
  const_iterator __it;
  unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true> *this_00;
  __node_base_ptr p_Var1;
  pointer pFVar2;
  data_ptr_t pdVar3;
  _Hash_node_base *p_Var4;
  __hash_code __code;
  __node_base_ptr p_Var5;
  idx_t buffer_id;
  __node_gen_type __node_gen;
  _Hash_node_base *local_30;
  optional_idx local_28;
  
  local_30 = (_Hash_node_base *)(ptr.data & 0xffffffff);
  p_Var1 = (this->buffers)._M_h._M_buckets[(ulong)local_30 % (this->buffers)._M_h._M_bucket_count];
  for (p_Var5 = p_Var1->_M_nxt; local_30 != p_Var5[1]._M_nxt; p_Var5 = p_Var5->_M_nxt) {
    p_Var1 = p_Var5;
  }
  __it.
  super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
             )p_Var1->_M_nxt;
  this_00 = (unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             *)((long)__it.
                      super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                      ._M_cur + 0x10);
  pFVar2 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
           operator->(this_00);
  pdVar3 = FixedSizeBuffer::Get(pFVar2,true);
  if (pdVar3 != (data_ptr_t)0x0) {
    *(ulong *)(pdVar3 + (ulong)((uint)(ptr.data >> 0x26) & 0x3ffff) * 8) =
         *(ulong *)(pdVar3 + (ulong)((uint)(ptr.data >> 0x26) & 0x3ffff) * 8) |
         1L << ((byte)(ptr.data >> 0x20) & 0x3f);
  }
  this->total_segment_count = this->total_segment_count - 1;
  pFVar2 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
           operator->(this_00);
  pFVar2->segment_count = pFVar2->segment_count - 1;
  pFVar2 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
           operator->(this_00);
  if (pFVar2->segment_count == 0) {
    if ((this->buffers_with_free_space)._M_h._M_element_count != 1) {
      ::std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase(&(this->buffers_with_free_space)._M_h,&local_30);
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(&(this->buffers)._M_h,__it);
      p_Var4 = (_Hash_node_base *)optional_idx::GetIndex(&this->buffer_with_free_space);
      if (p_Var4 == local_30) {
        NextBufferWithFreeSpace(this);
      }
    }
  }
  else {
    local_28.index = (idx_t)&this->buffers_with_free_space;
    ::std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
              ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_28.index,&local_30);
    if ((this->buffer_with_free_space).index == 0xffffffffffffffff) {
      optional_idx::optional_idx(&local_28,(idx_t)local_30);
      (this->buffer_with_free_space).index = local_28.index;
    }
  }
  return;
}

Assistant:

void FixedSizeAllocator::Free(const IndexPointer ptr) {
	auto buffer_id = ptr.GetBufferId();
	auto offset = ptr.GetOffset();

	auto buffer_it = buffers.find(buffer_id);
	D_ASSERT(buffer_it != buffers.end());
	auto &buffer = buffer_it->second;

	auto bitmask_ptr = reinterpret_cast<validity_t *>(buffer->Get());
	ValidityMask mask(bitmask_ptr, offset + 1); // FIXME
	D_ASSERT(!mask.RowIsValid(offset));
	mask.SetValid(offset);

	D_ASSERT(total_segment_count > 0);
	D_ASSERT(buffer->segment_count > 0);

	// Adjust the allocator fields.
	total_segment_count--;
	buffer->segment_count--;

	// Early-out, if the buffer is not empty.
	if (buffer->segment_count != 0) {
		buffers_with_free_space.insert(buffer_id);
		if (!buffer_with_free_space.IsValid()) {
			buffer_with_free_space = buffer_id;
		}
		return;
	}

	// The segment count went to 0, i.e, the buffer is now empty.
	// We keep the buffer alive, if it is the only buffer with free space.
	// We do so to prevent too much buffer creation fluctuation.
	if (buffers_with_free_space.size() == 1) {
		D_ASSERT(*buffers_with_free_space.begin() == buffer_id);
		D_ASSERT(buffer_with_free_space.GetIndex() == buffer_id);
		return;
	}

	D_ASSERT(buffer_with_free_space.IsValid());
	buffers_with_free_space.erase(buffer_id);
	buffers.erase(buffer_it);

	// Cache the next buffer that we're going to fill.
	if (buffer_with_free_space.GetIndex() == buffer_id) {
		NextBufferWithFreeSpace();
	}
}